

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::visitSymbol
          (TGlslangToSpvTraverser *this,TIntermSymbol *symbol)

{
  Builder *this_00;
  bool bVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  _Hash_node_base *p_Var4;
  TIntermediate *this_01;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Id typeId;
  Id IVar9;
  Id IVar10;
  StorageClass SVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar12;
  mapped_type *pmVar13;
  undefined4 extraout_var_04;
  long lVar14;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TTypeList *pTVar15;
  _Hash_node_base *p_Var16;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  iterator iVar17;
  undefined4 extraout_var_17;
  mapped_type *ppTVar18;
  __hash_code __code;
  ulong uVar19;
  char *pcVar20;
  uint typeId_00;
  char *pcVar21;
  ulong uVar22;
  __node_base_ptr p_Var23;
  __node_base_ptr p_Var24;
  Id id;
  SpvBuildLogger *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> components;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_03;
  
  if (this->linkageOnly == false) {
    iVar7 = (**(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(symbol);
    iVar7 = *(int *)(CONCAT44(extraout_var,iVar7) + 0xc);
    iVar8 = (**(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(symbol);
    if (*(long *)CONCAT44(extraout_var_00,iVar8) == 0) {
      pcVar20 = (char *)0x0;
    }
    else {
      pcVar20 = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 8);
    }
    spv::Builder::setDebugSourceLocation(&this->builder,iVar7,pcVar20);
  }
  iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar7 == 0x16) {
    return;
  }
  bVar1 = (this->builder).generatingOpCodeForSpecConst;
  iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x128))
                    ((long *)CONCAT44(extraout_var_01,iVar7));
  if (cVar5 != '\0') {
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
    iVar8 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    plVar12 = (long *)CONCAT44(extraout_var_03,iVar8);
    cVar5 = (**(code **)(*plVar12 + 0x128))(plVar12);
    if (cVar5 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)plVar12[0xd];
    pmVar13 = std::__detail::
              _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->glslangTypeToIdMap,(key_type *)&components);
    *pmVar13 = CONCAT44(extraout_var_02,iVar7);
  }
  iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x58))
                     ((long *)CONCAT44(extraout_var_04,iVar7));
  if ((*(byte *)(lVar14 + 0xc) & 1) != 0) {
    (this->builder).generatingOpCodeForSpecConst = true;
  }
  iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar7 == 0x1b) goto LAB_0043902e;
  id = getSymbolId(this,symbol);
  iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x58))
                     ((long *)CONCAT44(extraout_var_05,iVar7));
  if ((*(uint *)(lVar14 + 8) & 0x7f) == 0xf) {
    this->taskPayloadID = id;
  }
  ppIVar2 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar3 = ppIVar2[id];
  if (pIVar3 == (Instruction *)0x0) {
    uVar22 = 0;
  }
  else {
    uVar22 = (ulong)pIVar3->typeId;
  }
  this_00 = &this->builder;
  IVar10 = id;
  if (ppIVar2[uVar22]->opCode == OpTypePointer) {
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0x58))
                       ((long *)CONCAT44(extraout_var_06,iVar7));
    if ((0x13 < (*(uint *)(lVar14 + 8) & 0x7f)) ||
       ((0xd0000U >> (*(uint *)(lVar14 + 8) & 0x1f) & 1) == 0)) {
      iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar7) + 0x58))
                         ((long *)CONCAT44(extraout_var_08,iVar7));
      if (1 < (*(uint *)(lVar14 + 8) & 0x7f) - 0x11) {
        iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
        cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar7) + 0x128))
                          ((long *)CONCAT44(extraout_var_09,iVar7));
        if (cVar5 != '\0') {
          iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
          pTVar15 = glslang::TType::getStruct((TType *)CONCAT44(extraout_var_10,iVar7));
          if ((pTVar15->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              (pTVar15->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start) goto LAB_00438a89;
        }
        pIVar3 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[id];
        if (pIVar3 == (Instruction *)0x0) {
          IVar10 = 0;
        }
        else {
          IVar10 = pIVar3->typeId;
        }
        SVar11 = spv::Module::getStorageClass(&(this->builder).module,IVar10);
        if (((0x103ff < (this->glslangIntermediate->spvVersion).spv) &&
            (bVar6 = spv::Builder::isGlobalVariable(this_00,id), bVar6)) ||
           ((SVar11 | StorageClassUniform) == Output)) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&this->iOSet,&id);
        }
      }
    }
LAB_00438a89:
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x58))
                       ((long *)CONCAT44(extraout_var_07,iVar7));
    IVar10 = id;
    if ((*(uint *)(lVar14 + 8) & 0x7f) == 3) {
      uVar22 = (this->forceType)._M_h._M_bucket_count;
      uVar19 = (ulong)id % uVar22;
      p_Var23 = (this->forceType)._M_h._M_buckets[uVar19];
      p_Var24 = (__node_base_ptr)0x0;
      if ((p_Var23 != (__node_base_ptr)0x0) &&
         (p_Var16 = p_Var23->_M_nxt, p_Var24 = p_Var23, *(Id *)&p_Var23->_M_nxt[1]._M_nxt != id)) {
        while (p_Var23 = p_Var16, p_Var16 = p_Var23->_M_nxt, p_Var16 != (_Hash_node_base *)0x0) {
          p_Var24 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var16[1]._M_nxt % uVar22 != uVar19) ||
             (p_Var24 = p_Var23, *(uint *)&p_Var16[1]._M_nxt == id)) goto LAB_00438baa;
        }
        p_Var24 = (__node_base_ptr)0x0;
      }
LAB_00438baa:
      if (p_Var24 == (__node_base_ptr)0x0) {
        p_Var16 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var16 = p_Var24->_M_nxt;
      }
      if (p_Var16 != (_Hash_node_base *)0x0) {
        ppIVar2 = (this->builder).module.idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar3 = ppIVar2[id];
        if (pIVar3 == (Instruction *)0x0) {
          typeId_00 = 0;
        }
        else {
          typeId_00 = pIVar3->typeId;
        }
        if (ppIVar2[typeId_00]->opCode != OpTypePointer) {
          __assert_fail("builder.isPointerType(objectTypeId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                        ,0x9ea,
                        "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::translateForcedType(spv::Id)"
                       );
        }
        local_80 = (SpvBuildLogger *)
                   CONCAT44(local_80._4_4_,*(undefined4 *)((long)&p_Var16[1]._M_nxt + 4));
        typeId = spv::Builder::getContainedTypeId(this_00,typeId_00);
        if ((this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[typeId]->opCode == OpTypeVector) {
          IVar9 = spv::Builder::getContainedTypeId(this_00,typeId);
          iVar7 = spv::Builder::getScalarTypeWidth(this_00,IVar9);
          if (iVar7 != 0x20) goto LAB_00438cca;
          iVar7 = spv::Builder::getScalarTypeWidth(this_00,(Id)local_80);
          if (iVar7 != 0x40) {
            local_80 = this->logger;
            pcVar21 = "forcing 32-bit vector type to non 64-bit scalar";
            pcVar20 = "";
            goto LAB_00438d70;
          }
          spv::Builder::clearAccessChain(this_00);
          spv::Builder::setAccessChainLValue(this_00,IVar10);
          IVar10 = spv::Builder::accessChainLoad
                             (this_00,DecorationMax,DecorationMax,DecorationMax,typeId,MaskNone,Max,
                              0);
          components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          IVar9 = spv::Builder::getContainedTypeId(this_00,typeId);
          local_50._M_dataplus._M_p._0_4_ =
               spv::Builder::createCompositeExtract(this_00,IVar10,IVar9,0);
          if (components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&components,
                       (iterator)
                       components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_50);
          }
          else {
            *components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (Id)local_50._M_dataplus._M_p;
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          IVar9 = spv::Builder::getContainedTypeId(this_00,typeId);
          local_50._M_dataplus._M_p._0_4_ =
               spv::Builder::createCompositeExtract(this_00,IVar10,IVar9,1);
          if (components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&components,
                       (iterator)
                       components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_50);
          }
          else {
            *components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (Id)local_50._M_dataplus._M_p;
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          IVar10 = spv::Builder::getContainedTypeId(this_00,typeId);
          IVar10 = spv::Builder::makeVectorType(this_00,IVar10,2);
          IVar10 = spv::Builder::createCompositeConstruct(this_00,IVar10,&components);
          IVar10 = spv::Builder::createUnaryOp(this_00,OpBitcast,(Id)local_80,IVar10);
          if (components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00438daa;
          uVar22 = (long)components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
LAB_00438da0:
          operator_delete(components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start,uVar22);
        }
        else {
LAB_00438cca:
          if ((this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[typeId]->opCode == OpTypeMatrix) {
            spv::Builder::clearAccessChain(this_00);
            spv::Builder::setAccessChainLValue(this_00,IVar10);
            IVar10 = spv::Builder::accessChainLoad
                               (this_00,DecorationMax,DecorationMax,DecorationMax,typeId,MaskNone,
                                Max,0);
            IVar10 = spv::Builder::createUnaryOp(this_00,OpTranspose,(Id)local_80,IVar10);
          }
          else {
            local_80 = this->logger;
            pcVar21 = "forcing non 32-bit vector type";
            pcVar20 = "";
LAB_00438d70:
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&components.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>((string *)&components,pcVar21,pcVar20);
            spv::SpvBuildLogger::missingFunctionality(local_80,(string *)&components);
            if ((pointer *)
                components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                &components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
              uVar22 = (long)components.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage + 1;
              goto LAB_00438da0;
            }
          }
        }
      }
    }
  }
LAB_00438daa:
  id = IVar10;
  if ((this->linkageOnly != true) ||
     (iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol),
     (*(ulong *)(CONCAT44(extraout_var_11,iVar7) + 8) & 0x100000000) != 0)) {
    spv::Builder::clearAccessChain(this_00);
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol);
    if ((*(ulong *)(CONCAT44(extraout_var_12,iVar7) + 8) & 0x100000000) == 0) {
      iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
      p_Var16 = (_Hash_node_base *)CONCAT44(extraout_var_13,iVar7);
      uVar22 = (this->rValueParameters)._M_h._M_bucket_count;
      uVar19 = (ulong)p_Var16 % uVar22;
      p_Var23 = (this->rValueParameters)._M_h._M_buckets[uVar19];
      p_Var24 = (__node_base_ptr)0x0;
      if ((p_Var23 != (__node_base_ptr)0x0) &&
         (p_Var4 = p_Var23->_M_nxt, p_Var24 = p_Var23, p_Var16 != p_Var23->_M_nxt[1]._M_nxt)) {
        while (p_Var23 = p_Var4, p_Var4 = p_Var23->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var24 = (__node_base_ptr)0x0;
          if (((ulong)p_Var4[1]._M_nxt % uVar22 != uVar19) ||
             (p_Var24 = p_Var23, p_Var16 == p_Var4[1]._M_nxt)) goto LAB_00438e5d;
        }
        p_Var24 = (__node_base_ptr)0x0;
      }
LAB_00438e5d:
      if ((p_Var24 == (__node_base_ptr)0x0) || (p_Var24->_M_nxt == (_Hash_node_base *)0x0)) {
        ppIVar2 = (this->builder).module.idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar3 = ppIVar2[id];
        if (pIVar3 == (Instruction *)0x0) {
          uVar22 = 0;
        }
        else {
          uVar22 = (ulong)pIVar3->typeId;
        }
        if (ppIVar2[uVar22]->opCode == OpTypePointer) {
          spv::Builder::setAccessChainLValue(this_00,id);
          goto LAB_00438ea8;
        }
      }
    }
    (this->builder).accessChain.isRValue = true;
    (this->builder).accessChain.base = id;
  }
LAB_00438ea8:
  if ((this->linkageOnly == true) && (this->glslangIntermediate->hlslFunctionality1 == true)) {
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar7) + 0x58))
                       ((long *)CONCAT44(extraout_var_14,iVar7));
    if ((*(uint *)(lVar14 + 8) & 0x7f) - 5 < 2) {
      this_01 = this->glslangIntermediate;
      iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
      bVar6 = glslang::TIntermediate::hasCounterBufferName
                        (this_01,(TString *)CONCAT44(extraout_var_15,iVar7));
      if (bVar6) {
        iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&components,*(char **)(CONCAT44(extraout_var_16,iVar7) + 8),
                   (allocator<char> *)&local_50);
        iVar17 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->counterOriginator)._M_h,(key_type *)&components);
        if (((iVar17.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
              ._M_cur != (__node_type *)0x0) &&
            (id = getSymbolId(this,*(TIntermSymbol **)
                                    ((long)iVar17.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
                                           ._M_cur + 0x28)), id != 0)) &&
           (IVar10 = getSymbolId(this,symbol), IVar10 != 0)) {
          spv::Builder::addExtension(this_00,"SPV_GOOGLE_hlsl_functionality1");
          spv::Builder::addDecorationId(this_00,id,CounterBuffer,IVar10);
        }
      }
      else {
        iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&components,*(char **)(CONCAT44(extraout_var_17,iVar7) + 8),
                   (allocator<char> *)&local_50);
        glslang::TIntermediate::addCounterBufferName<std::__cxx11::string>
                  (&local_50,this->glslangIntermediate,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&components)
        ;
        std::__cxx11::string::operator=((string *)&components,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(Id)local_50._M_dataplus._M_p) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_50._M_dataplus._M_p._4_4_,(Id)local_50._M_dataplus._M_p),
                          local_50.field_2._M_allocated_capacity + 1);
        }
        ppTVar18 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->counterOriginator,(key_type *)&components);
        *ppTVar18 = symbol;
      }
      if ((pointer *)
          components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)components.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
    }
  }
LAB_0043902e:
  (this->builder).generatingOpCodeForSpecConst = bVar1;
  return;
}

Assistant:

void TGlslangToSpvTraverser::visitSymbol(glslang::TIntermSymbol* symbol)
{
    // We update the line information even though no code might be generated here
    // This is helpful to yield correct lines for control flow instructions
    if (!linkageOnly) {
        builder.setDebugSourceLocation(symbol->getLoc().line, symbol->getLoc().getFilename());
    }

    if (symbol->getBasicType() == glslang::EbtFunction) {
        return;
    }

    SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
    if (symbol->getType().isStruct())
        glslangTypeToIdMap[symbol->getType().getStruct()] = symbol->getId();

    if (symbol->getType().getQualifier().isSpecConstant())
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
#ifdef ENABLE_HLSL
    // Skip symbol handling if it is string-typed
    if (symbol->getBasicType() == glslang::EbtString)
        return;
#endif

    // getSymbolId() will set up all the IO decorations on the first call.
    // Formal function parameters were mapped during makeFunctions().
    spv::Id id = getSymbolId(symbol);

    if (symbol->getType().getQualifier().isTaskPayload())
        taskPayloadID = id; // cache the taskPayloadID to be used it as operand for OpEmitMeshTasksEXT

    if (builder.isPointer(id)) {
        if (!symbol->getType().getQualifier().isParamInput() &&
            !symbol->getType().getQualifier().isParamOutput()) {
            // Include all "static use" and "linkage only" interface variables on the OpEntryPoint instruction
            // Consider adding to the OpEntryPoint interface list.
            // Only looking at structures if they have at least one member.
            if (!symbol->getType().isStruct() || symbol->getType().getStruct()->size() > 0) {
                spv::StorageClass sc = builder.getStorageClass(id);
                // Before SPIR-V 1.4, we only want to include Input and Output.
                // Starting with SPIR-V 1.4, we want all globals.
                if ((glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4 && builder.isGlobalVariable(id)) ||
                    (sc == spv::StorageClassInput || sc == spv::StorageClassOutput)) {
                    iOSet.insert(id);
                }
            }
        }

        // If the SPIR-V type is required to be different than the AST type
        // (for ex SubgroupMasks or 3x4 ObjectToWorld/WorldToObject matrices),
        // translate now from the SPIR-V type to the AST type, for the consuming
        // operation.
        // Note this turns it from an l-value to an r-value.
        // Currently, all symbols needing this are inputs; avoid the map lookup when non-input.
        if (symbol->getType().getQualifier().storage == glslang::EvqVaryingIn)
            id = translateForcedType(id);
    }

    // Only process non-linkage-only nodes for generating actual static uses
    if (! linkageOnly || symbol->getQualifier().isSpecConstant()) {
        // Prepare to generate code for the access

        // L-value chains will be computed left to right.  We're on the symbol now,
        // which is the left-most part of the access chain, so now is "clear" time,
        // followed by setting the base.
        builder.clearAccessChain();

        // For now, we consider all user variables as being in memory, so they are pointers,
        // except for
        // A) R-Value arguments to a function, which are an intermediate object.
        //    See comments in handleUserFunctionCall().
        // B) Specialization constants (normal constants don't even come in as a variable),
        //    These are also pure R-values.
        // C) R-Values from type translation, see above call to translateForcedType()
        glslang::TQualifier qualifier = symbol->getQualifier();
        if (qualifier.isSpecConstant() || rValueParameters.find(symbol->getId()) != rValueParameters.end() ||
            !builder.isPointerType(builder.getTypeId(id)))
            builder.setAccessChainRValue(id);
        else
            builder.setAccessChainLValue(id);
    }

#ifdef ENABLE_HLSL
    // Process linkage-only nodes for any special additional interface work.
    if (linkageOnly) {
        if (glslangIntermediate->getHlslFunctionality1()) {
            // Map implicit counter buffers to their originating buffers, which should have been
            // seen by now, given earlier pruning of unused counters, and preservation of order
            // of declaration.
            if (symbol->getType().getQualifier().isUniformOrBuffer()) {
                if (!glslangIntermediate->hasCounterBufferName(symbol->getName())) {
                    // Save possible originating buffers for counter buffers, keyed by
                    // making the potential counter-buffer name.
                    std::string keyName = symbol->getName().c_str();
                    keyName = glslangIntermediate->addCounterBufferName(keyName);
                    counterOriginator[keyName] = symbol;
                } else {
                    // Handle a counter buffer, by finding the saved originating buffer.
                    std::string keyName = symbol->getName().c_str();
                    auto it = counterOriginator.find(keyName);
                    if (it != counterOriginator.end()) {
                        id = getSymbolId(it->second);
                        if (id != spv::NoResult) {
                            spv::Id counterId = getSymbolId(symbol);
                            if (counterId != spv::NoResult) {
                                builder.addExtension("SPV_GOOGLE_hlsl_functionality1");
                                builder.addDecorationId(id, spv::DecorationHlslCounterBufferGOOGLE, counterId);
                            }
                        }
                    }
                }
            }
        }
    }
#endif
}